

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::GLES2TextureSharingTest::renderResource
          (GLES2TextureSharingTest *this,Surface *screen,Surface *reference)

{
  glReadPixelsFunc p_Var1;
  GLenum GVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLint GVar5;
  uint uVar6;
  TestError *pTVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  GLsizei GVar12;
  uint uVar13;
  uint uVar14;
  void *data;
  int iVar15;
  int iVar16;
  Vec4 color;
  ProgramSources sources;
  ShaderProgram program;
  undefined1 local_218 [32];
  Surface *local_1f8;
  value_type local_1f0;
  ProgramSources local_1d0;
  ShaderProgram local_100;
  
  local_218._0_8_ = (long)local_218 + 0x10;
  local_1f8 = reference;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_218,
             "attribute mediump vec2 a_pos;\nattribute mediump vec2 a_texCorod;\nvarying mediump vec2 v_texCoord;\nvoid main(void)\n{\n\tv_texCoord = a_texCorod;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}\n"
             ,"");
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,
             "varying mediump vec2 v_texCoord;\nuniform sampler2D u_sampler;\nvoid main(void)\n{\n\tgl_FragColor = texture2D(u_sampler, v_texCoord);\n}\n"
             ,"");
  local_1d0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_1d0._193_8_ = 0;
  local_1d0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_1d0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  memset(&local_1d0,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_1d0.sources,(value_type *)local_218);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_1d0.sources + 1,&local_1f0);
  glu::ShaderProgram::ShaderProgram(&local_100,&(this->super_GLES2SharingTest).m_gl,&local_1d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d0.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1d0.attribLocationBindings);
  lVar11 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_1d0.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar11));
    lVar11 = lVar11 + -0x18;
  } while (lVar11 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if (local_218._0_8_ != (long)local_218 + 0x10) {
    operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
  }
  if (local_100.m_program.m_info.linkOk == false) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Failed to compile shader program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
               ,0x219);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if (screen == (Surface *)0x0) {
    iVar10 = 0xf0;
    GVar12 = 0xf0;
  }
  else {
    GVar12 = screen->m_width;
    iVar10 = screen->m_height;
  }
  (*(this->super_GLES2SharingTest).m_gl.viewport)(0,0,GVar12,iVar10);
  GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar2,"viewport(0, 0, width, height)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x237);
  (*(this->super_GLES2SharingTest).m_gl.clearColor)(1.0,0.0,0.0,1.0);
  GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar2,"clearColor(1.0f, 0.0f, 0.0f, 1.0f)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x239);
  (*(this->super_GLES2SharingTest).m_gl.clear)(0x4000);
  GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar2,"clear(GL_COLOR_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x23a);
  (*(this->super_GLES2SharingTest).m_gl.useProgram)(local_100.m_program.m_program);
  GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar2,"useProgram(program.getProgram())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x23c);
  GVar3 = (*(this->super_GLES2SharingTest).m_gl.getAttribLocation)
                    (local_100.m_program.m_program,"a_pos");
  GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar2,"glGetAttribLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x23f);
  if (GVar3 == 0xffffffff) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,(char *)0x0,"coordLocation != (GLuint)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
               ,0x240);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  GVar4 = (*(this->super_GLES2SharingTest).m_gl.getAttribLocation)
                    (local_100.m_program.m_program,"a_texCorod");
  GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar2,"glGetAttribLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x243);
  if (GVar4 == 0xffffffff) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,(char *)0x0,"texCoordLocation != (GLuint)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
               ,0x244);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  GVar5 = (*(this->super_GLES2SharingTest).m_gl.getUniformLocation)
                    (local_100.m_program.m_program,"u_sampler");
  GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar2,"glGetUniformLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x248);
  if (GVar5 != -1) {
    (*(this->super_GLES2SharingTest).m_gl.activeTexture)(0x84c0);
    GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar2,"activeTexture(GL_TEXTURE0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x24b);
    (*(this->super_GLES2SharingTest).m_gl.bindTexture)(0xde1,this->m_glTexture);
    GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar2,"bindTexture(GL_TEXTURE_2D, m_glTexture)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x24c);
    (*(this->super_GLES2SharingTest).m_gl.uniform1i)(GVar5,0);
    GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar2,"uniform1i(samplerLocation, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x24e);
    (*(this->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(GVar4);
    GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar2,"enableVertexAttribArray(texCoordLocation)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x250);
    (*(this->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(GVar3);
    GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar2,"enableVertexAttribArray(coordLocation)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x251);
    (*(this->super_GLES2SharingTest).m_gl.vertexAttribPointer)
              (GVar4,2,0x1406,'\0',0,renderResource::texCoords);
    GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar2,
                    "vertexAttribPointer(texCoordLocation, 2, GL_FLOAT, GL_FALSE, 0, texCoords)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x253);
    (*(this->super_GLES2SharingTest).m_gl.vertexAttribPointer)
              (GVar3,2,0x1406,'\0',0,renderResource::coords);
    GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar2,"vertexAttribPointer(coordLocation, 2, GL_FLOAT, GL_FALSE, 0, coords)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x254);
    (*(this->super_GLES2SharingTest).m_gl.drawElements)(4,6,0x1403,renderResource::indices);
    GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar2,"drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, indices)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x256);
    (*(this->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(GVar3);
    GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar2,"disableVertexAttribArray(coordLocation)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,599);
    (*(this->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(GVar4);
    GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar2,"disableVertexAttribArray(texCoordLocation)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,600);
    (*(this->super_GLES2SharingTest).m_gl.bindTexture)(0xde1,0);
    GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar2,"bindTexture(GL_TEXTURE_2D, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x25a);
    (*(this->super_GLES2SharingTest).m_gl.useProgram)(0);
    GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar2,"useProgram(0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x25b);
    if (screen != (Surface *)0x0) {
      p_Var1 = (this->super_GLES2SharingTest).m_gl.readPixels;
      iVar16 = screen->m_width;
      iVar15 = screen->m_height;
      local_218._0_4_ = RGBA;
      local_218._4_4_ = UNORM_INT8;
      data = (void *)(screen->m_pixels).m_cap;
      if (data != (void *)0x0) {
        data = (screen->m_pixels).m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&local_1d0,(TextureFormat *)local_218,iVar16,iVar15,1,data);
      (*p_Var1)(0,0,iVar16,iVar15,0x1908,0x1401,
                (void *)CONCAT44(local_1d0.sources[1].
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                 local_1d0.sources[1].
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._0_4_));
      if (0 < GVar12) {
        uVar13 = 0;
        iVar16 = 0;
        do {
          if (0 < iVar10) {
            iVar15 = 0;
            do {
              local_1d0.sources[0].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x200000002;
              local_1d0.sources[0].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x100000002;
              local_1d0.sources[0].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_00000001;
              local_1d0.sources[1].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_1_ = 1;
              local_1d0.sources[2].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
              local_1d0.sources[1].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
              local_1d0.sources._45_8_ = 0;
              local_1d0.sources[1].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
              local_1d0.sources[1].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
              local_1d0.sources[1].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
              local_1d0.sources[1].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
              tcu::sampleLevelArray2D
                        ((ConstPixelBufferAccess *)local_218,(int)(this->m_texture).m_view.m_levels,
                         (Sampler *)(ulong)(uint)(this->m_texture).m_view.m_numLevels,
                         (float)iVar16 / ((float)GVar12 + -1.0),
                         (float)iVar15 / ((float)iVar10 + -1.0),(int)&local_1d0,0.0);
              uVar6 = (uint)((float)local_218._0_4_ * 255.0);
              if (0xfe < (int)uVar6) {
                uVar6 = 0xff;
              }
              if ((int)uVar6 < 1) {
                uVar6 = uVar13;
              }
              uVar8 = (uint)((float)local_218._4_4_ * 255.0);
              if (0xfe < (int)uVar8) {
                uVar8 = 0xff;
              }
              if ((int)uVar8 < 1) {
                uVar8 = uVar13;
              }
              uVar9 = (uint)((float)local_218._8_4_ * 255.0);
              if (0xfe < (int)uVar9) {
                uVar9 = 0xff;
              }
              if ((int)uVar9 < 1) {
                uVar9 = uVar13;
              }
              uVar14 = (uint)((float)local_218._12_4_ * 255.0);
              if (0xfe < (int)uVar14) {
                uVar14 = 0xff;
              }
              if ((int)uVar14 < 1) {
                uVar14 = uVar13;
              }
              *(uint *)((long)(local_1f8->m_pixels).m_ptr +
                       (long)(local_1f8->m_width * iVar15 + iVar16) * 4) =
                   uVar9 << 0x10 | uVar14 << 0x18 | uVar8 << 8 | uVar6;
              iVar15 = iVar15 + 1;
            } while (iVar10 != iVar15);
          }
          iVar16 = iVar16 + 1;
        } while (iVar16 != GVar12);
      }
    }
    glu::ShaderProgram::~ShaderProgram(&local_100);
    return;
  }
  pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar7,(char *)0x0,"samplerLocation != (GLuint)-1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
             ,0x249);
  __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GLES2TextureSharingTest::renderResource (tcu::Surface* screen, tcu::Surface* reference)
{
	DE_ASSERT((screen && reference) || (!screen && !reference));

	const char* vertexShader = ""
	"attribute mediump vec2 a_pos;\n"
	"attribute mediump vec2 a_texCorod;\n"
	"varying mediump vec2 v_texCoord;\n"
	"void main(void)\n"
	"{\n"
	"\tv_texCoord = a_texCorod;\n"
	"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
	"}\n";

	const char* fragmentShader = ""
	"varying mediump vec2 v_texCoord;\n"
	"uniform sampler2D u_sampler;\n"
	"void main(void)\n"
	"{\n"
	"\tgl_FragColor = texture2D(u_sampler, v_texCoord);\n"
	"}\n";

	glu::ShaderProgram program(m_gl, glu::makeVtxFragSources(vertexShader, fragmentShader));

	if (!program.isOk())
		TCU_FAIL("Failed to compile shader program");

	int width = 240;
	int height = 240;

	if (screen)
	{
		width = screen->getWidth();
		height = screen->getHeight();
	}

	static const GLfloat coords[] = {
		-1.0f, -1.0f,
		 1.0f, -1.0f,
		 1.0f,  1.0f,
		-1.0f,  1.0f
	};

	static const GLfloat texCoords[] = {
		0.0f, 0.0f,
		1.0f, 0.0f,
		1.0f, 1.0f,
		0.0f, 1.0f
	};

	static const GLushort indices[] = {
		0, 1, 2,
		2, 3, 0
	};

	GLU_CHECK_GLW_CALL(m_gl, viewport(0, 0, width, height));

	GLU_CHECK_GLW_CALL(m_gl, clearColor(1.0f, 0.0f, 0.0f, 1.0f));
	GLU_CHECK_GLW_CALL(m_gl, clear(GL_COLOR_BUFFER_BIT));

	GLU_CHECK_GLW_CALL(m_gl, useProgram(program.getProgram()));

	GLuint coordLocation = m_gl.getAttribLocation(program.getProgram(), "a_pos");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(coordLocation != (GLuint)-1);

	GLuint texCoordLocation = m_gl.getAttribLocation(program.getProgram(), "a_texCorod");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(texCoordLocation != (GLuint)-1);


	GLuint samplerLocation = m_gl.getUniformLocation(program.getProgram(), "u_sampler");
	GLU_CHECK_GLW_MSG(m_gl, "glGetUniformLocation()");
	TCU_CHECK(samplerLocation != (GLuint)-1);

	GLU_CHECK_GLW_CALL(m_gl, activeTexture(GL_TEXTURE0));
	GLU_CHECK_GLW_CALL(m_gl, bindTexture(GL_TEXTURE_2D, m_glTexture));

	GLU_CHECK_GLW_CALL(m_gl, uniform1i(samplerLocation, 0));

	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(texCoordLocation));
	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(coordLocation));

	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(texCoordLocation, 2, GL_FLOAT, GL_FALSE, 0, texCoords));
	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(coordLocation, 2, GL_FLOAT, GL_FALSE, 0, coords));

	GLU_CHECK_GLW_CALL(m_gl, drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, indices));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(coordLocation));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(texCoordLocation));

	GLU_CHECK_GLW_CALL(m_gl, bindTexture(GL_TEXTURE_2D, 0));
	GLU_CHECK_GLW_CALL(m_gl, useProgram(0));

	if (screen)
	{
		m_gl.readPixels(0, 0, screen->getWidth(), screen->getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, screen->getAccess().getDataPtr());

		for (int x = 0; x < width; x++)
		{
			for (int y = 0; y < height; y++)
			{
				float t = ((float)x / ((float)width - 1.0f));
				float s = ((float)y / ((float)height - 1.0f));
				float lod = 0.0f;

				tcu::Vec4 color = m_texture.sample(tcu::Sampler(tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL, tcu::Sampler::LINEAR, tcu::Sampler::LINEAR), t, s, lod);

				int r = deClamp32((int)(255.0f * color.x()), 0, 255);
				int g = deClamp32((int)(255.0f * color.y()), 0, 255);
				int b = deClamp32((int)(255.0f * color.z()), 0, 255);
				int a = deClamp32((int)(255.0f * color.w()), 0, 255);

				reference->setPixel(x, y, tcu::RGBA(r, g, b, a));
			}
		}
	}
}